

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  DashelException *e;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  undefined1 local_178 [8];
  PingClient client_1;
  string local_f0;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  PingClient client;
  char **argv_local;
  int argc_local;
  
  client._120_8_ = argv;
  if (argc < 3) {
    if (argc < 2) {
      PingServer::PingServer((PingServer *)&e);
      Dashel::Hub::run();
      PingServer::~PingServer((PingServer *)&e);
    }
    else {
      pcVar1 = argv[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,pcVar1,&local_199);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"default message, the other side does lack creativity",
                 &local_1c1);
      PingClient::PingClient((PingClient *)local_178,&local_198,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator(&local_199);
      PingClient::~PingClient((PingClient *)local_178);
    }
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar1,&local_b9);
    pcVar1 = *(char **)(client._120_8_ + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,pcVar1,(allocator<char> *)&client_1.field_0x7f);
    PingClient::PingClient((PingClient *)local_98,&local_b8,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&client_1.field_0x7f);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    PingClient::~PingClient((PingClient *)local_98);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	try
	{
		if (argc > 2)
		{
			PingClient client(argv[1], argv[2]);
		}
		else if (argc > 1)
		{
			PingClient client(argv[1], "default message, the other side does lack creativity");
		}
		else
		{
			PingServer().run();
		}
	}
	catch (const DashelException& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}